

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::FrameBufferBindingTestCase::test
          (FrameBufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  allocator<char> local_dd;
  GLuint framebufferId;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  code *local_38;
  GLenum local_30;
  
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  framebufferId = 0;
  glu::CallLogWrapper::glGenFramebuffers(gl,1,&framebufferId);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glGenFramebuffers");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  glu::CallLogWrapper::glBindFramebuffer(gl,0x8d40,framebufferId);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glBindFramebuffer");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8ca6,framebufferId,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindFramebuffer(gl,0x8d40,0);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glBindFramebuffer");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindFramebuffer(gl,0x8d40,framebufferId);
  glu::CallLogWrapper::glDeleteFramebuffers(gl,1,&framebufferId);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glDeleteFramebuffers");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);

		GLuint framebufferId = 0;
		gl.glGenFramebuffers(1, &framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenFramebuffers");

		gl.glBindFramebuffer(GL_FRAMEBUFFER, framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindFramebuffer");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, framebufferId, m_type);

		gl.glBindFramebuffer(GL_FRAMEBUFFER, 0);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindFramebuffer");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);

		gl.glBindFramebuffer(GL_FRAMEBUFFER, framebufferId);
		gl.glDeleteFramebuffers(1, &framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteFramebuffers");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);
	}